

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

void anon_unknown.dwarf_45453::replace(string *str,string *keyword,subst *fn)

{
  runtime_error *this;
  long lVar1;
  string *in_RDX;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> mod;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> replace;
  size_type krpos;
  size_type klpos;
  bool mok;
  size_type mrpos;
  size_type mlpos;
  string suffix;
  string prefix;
  size_type rpos;
  size_type lpos;
  undefined6 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3e;
  undefined1 in_stack_fffffffffffffe3f;
  char *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar3;
  bool local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  allocator *paVar4;
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  _Alloc_hider *local_c0;
  bool local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  allocator local_99;
  string local_98 [48];
  string local_68 [32];
  string local_48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_8;
  
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_8 = in_RDI;
  std::operator+((char *)in_RDX,in_stack_fffffffffffffe80);
  std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::__cxx11::string::~string(local_68);
  paVar4 = &local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"}",paVar4);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  while( true ) {
    local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::find((string *)local_8,(ulong)local_48);
    pfVar3 = local_8;
    if (local_20 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_48);
      return;
    }
    std::__cxx11::string::length();
    local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::find((string *)pfVar3,(ulong)local_98);
    if (local_28 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff)
    break;
    __args = local_20;
    pfVar3 = local_8;
    std::__cxx11::string::length();
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::find((char)pfVar3,0x7c);
    local_b0 = local_28;
    local_199 = local_a8 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0xffffffffffffffff && local_a8 < local_28;
    local_b1 = local_199;
    pbVar2 = local_20;
    lVar1 = std::__cxx11::string::length();
    local_c0 = &pbVar2->_M_dataplus + lVar1;
    pbVar2 = local_28;
    if ((local_b1 & 1U) != 0) {
      pbVar2 = local_a8;
    }
    local_c8 = pbVar2;
    std::__cxx11::string::substr((ulong)local_108,(ulong)local_8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(pfVar3,__args);
    std::__cxx11::string::~string(local_108);
    if ((local_b1 & 1U) != 0) {
      std::__cxx11::string::substr((ulong)local_128,(ulong)local_8);
      in_stack_fffffffffffffe3f =
           std::operator==(pbVar2,(char *)CONCAT17(in_stack_fffffffffffffe3f,
                                                   CONCAT16(in_stack_fffffffffffffe3e,
                                                            in_stack_fffffffffffffe38)));
      if ((bool)in_stack_fffffffffffffe3f) {
        util::toUpper(in_RDX);
        std::__cxx11::string::operator=(local_e8,local_148);
        std::__cxx11::string::~string(local_148);
      }
      else {
        in_stack_fffffffffffffe3e =
             std::operator==(pbVar2,(char *)CONCAT17(in_stack_fffffffffffffe3f,
                                                     CONCAT16(in_stack_fffffffffffffe3e,
                                                              in_stack_fffffffffffffe38)));
        if ((bool)in_stack_fffffffffffffe3e) {
          util::toLower(in_RDX);
          std::__cxx11::string::operator=(local_e8,local_168);
          std::__cxx11::string::~string(local_168);
        }
      }
      std::__cxx11::string::~string(local_128);
    }
    std::__cxx11::string::replace
              ((ulong)local_8,(ulong)local_20,(string *)((long)local_28 + (1 - (long)local_20)));
    lVar1 = std::__cxx11::string::length();
    local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (&local_20->_M_dataplus + lVar1);
    std::__cxx11::string::~string(local_e8);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Invalid pattern");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void replace(std::string& str, const std::string& keyword, subst fn) {
  std::string::size_type lpos = 0u;
  std::string::size_type rpos = 0u;
  const std::string prefix = "{" + keyword + ":";
  const std::string suffix = "}";
  while ((lpos = str.find(prefix, lpos)) != std::string::npos) {
    // Find corresponding suffix
    rpos = str.find(suffix, lpos + prefix.length());
    if (rpos == std::string::npos) {
      throw std::runtime_error("Invalid pattern");
    }

    // Lookup modifier (if any)
    auto mlpos = str.find('|', lpos + prefix.length());
    auto mrpos = rpos;
    auto mok = (mlpos != std::string::npos && mlpos < rpos);

    // Lookup replacement
    auto klpos = lpos + prefix.length();
    auto krpos = mok ? mlpos : rpos;
    auto replace = fn(str.substr(klpos, krpos - klpos));

    // Apply modifier (if applicable)
    if (mok) {
      auto mod = str.substr(mlpos + 1, mrpos - (mlpos + 1));
      if (mod == "upper") {
        replace = toUpper(replace);
      } else if (mod == "lower") {
        replace = toLower(replace);
      }
    }

    // Replace
    str.replace(lpos, rpos - lpos + 1, replace);
    lpos += replace.length();
  }
}